

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrEva.c
# Opt level: O0

void Rwr_CutCountNumNodes_rec(Abc_Obj_t *pObj,Cut_Cut_t *pCut,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_24;
  int i;
  Vec_Ptr_t *vNodes_local;
  Cut_Cut_t *pCut_local;
  Abc_Obj_t *pObj_local;
  
  local_24 = 0;
  while( true ) {
    if ((int)(*(uint *)pCut >> 0x1c) <= local_24) {
      iVar1 = Abc_ObjIsNode(pObj);
      if (iVar1 != 0) {
        if ((*(uint *)&pObj->field_0x14 >> 6 & 1) == 0) {
          *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xffffffbf | 0x40;
          Vec_PtrPush(vNodes,pObj);
        }
        pAVar2 = Abc_ObjFanin0(pObj);
        Rwr_CutCountNumNodes_rec(pAVar2,pCut,vNodes);
        pAVar2 = Abc_ObjFanin1(pObj);
        Rwr_CutCountNumNodes_rec(pAVar2,pCut,vNodes);
        return;
      }
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/rwr/rwrEva.c"
                    ,0x1aa,"void Rwr_CutCountNumNodes_rec(Abc_Obj_t *, Cut_Cut_t *, Vec_Ptr_t *)");
    }
    if (*(int *)(&pCut[1].field_0x0 + (long)local_24 * 4) == pObj->Id) break;
    local_24 = local_24 + 1;
  }
  if ((*(uint *)&pObj->field_0x14 >> 6 & 1) != 0) {
    return;
  }
  *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xffffffbf | 0x40;
  Vec_PtrPush(vNodes,pObj);
  return;
}

Assistant:

void Rwr_CutCountNumNodes_rec( Abc_Obj_t * pObj, Cut_Cut_t * pCut, Vec_Ptr_t * vNodes )
{
    int i;
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        if ( pCut->pLeaves[i] == pObj->Id )
        {
            // check if the node is collected
            if ( pObj->fMarkC == 0 )
            {
                pObj->fMarkC = 1;
                Vec_PtrPush( vNodes, pObj );
            }
            return;
        }
    assert( Abc_ObjIsNode(pObj) );
    // check if the node is collected
    if ( pObj->fMarkC == 0 )
    {
        pObj->fMarkC = 1;
        Vec_PtrPush( vNodes, pObj );
    }
    // traverse the fanins
    Rwr_CutCountNumNodes_rec( Abc_ObjFanin0(pObj), pCut, vNodes );
    Rwr_CutCountNumNodes_rec( Abc_ObjFanin1(pObj), pCut, vNodes );
}